

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O1

void __thiscall lzham::lzcompressor::state::clear(state *this)

{
  long lVar1;
  
  (this->super_state_base).m_cur_ofs = 0;
  (this->super_state_base).m_cur_state = 0;
  this->m_block_start_dict_ofs = 0;
  lVar1 = 1;
  do {
    lzham::quasi_adaptive_huffman_data_model::clear();
    lzham::quasi_adaptive_huffman_data_model::clear();
    lVar1 = lVar1 + -1;
  } while (lVar1 == 0);
  lzham::quasi_adaptive_huffman_data_model::clear();
  lzham::quasi_adaptive_huffman_data_model::clear();
  lzham::quasi_adaptive_huffman_data_model::clear();
  lzham::quasi_adaptive_huffman_data_model::clear();
  (this->super_state_base).m_match_hist[0] = 1;
  (this->super_state_base).m_match_hist[1] = 1;
  (this->super_state_base).m_match_hist[2] = 1;
  (this->super_state_base).m_match_hist[3] = 1;
  return;
}

Assistant:

void lzcompressor::state::clear()
   {
      m_cur_ofs = 0;
      m_cur_state = 0;
      m_block_start_dict_ofs = 0;

      for (uint i = 0; i < 2; i++)
      {
         m_rep_len_table[i].clear();
         m_large_len_table[i].clear();
      }
      m_main_table.clear();
      m_dist_lsb_table.clear();

		m_lit_table.clear();
      m_delta_lit_table.clear();

      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
   }